

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_split(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argcp)

{
  vm_val_t *this;
  CVmObjPageEntry *this_00;
  ushort uVar1;
  uint uVar2;
  vm_datatype_t vVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  int iVar7;
  int iVar8;
  int32_t iVar9;
  vm_obj_id_t vVar10;
  ulong uVar11;
  char *pcVar12;
  char *p;
  ushort *str_00;
  ushort *puVar13;
  uint16_t tmp;
  ulong idx;
  size_t len;
  CVmObjPattern *local_80;
  char *local_78;
  int match_len;
  int match_ofs;
  vm_val_t *local_68;
  ushort *local_60;
  ulong local_58;
  uint local_4c;
  ulong local_48;
  vm_val_t ele;
  
  local_68 = self_val;
  local_60 = (ushort *)str;
  if (getp_split(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_split();
  }
  if (argcp == (uint *)0x0) {
    retval->typ = VM_NATIVE_CODE;
    (retval->val).ptr = &getp_split::desc;
    return 1;
  }
  uVar2 = *argcp;
  iVar7 = CVmObject::get_prop_check_argc(retval,argcp,&getp_split::desc);
  pvVar6 = sp_;
  if (iVar7 != 0) {
    return 1;
  }
  uVar1 = *local_60;
  len = (size_t)uVar1;
  local_4c = uVar2;
  if (uVar2 == 0) {
    uVar5 = *(undefined4 *)&local_68->field_0x4;
    aVar4 = local_68->val;
    sp_ = sp_ + 1;
    pvVar6->typ = local_68->typ;
    *(undefined4 *)&pvVar6->field_0x4 = uVar5;
    pvVar6->val = aVar4;
    uVar11 = 1;
    local_78 = (char *)0x0;
    local_80 = (CVmObjPattern *)0x0;
LAB_00282459:
    iVar8 = (int)((((uint)uVar1 + (int)uVar11) - 1) / uVar11);
    iVar7 = 1;
    if (1 < iVar8) {
      iVar7 = iVar8;
    }
    local_58 = uVar11;
    if (len == 0) {
      iVar7 = iVar8;
    }
  }
  else {
    this = sp_ + -1;
    vVar3 = this->typ;
    uVar11 = (ulong)vVar3;
    if (vVar3 == VM_NIL) {
      local_78 = (char *)0x0;
      local_80 = (CVmObjPattern *)0x0;
    }
    else if (vVar3 == VM_INT) {
      uVar11 = (ulong)(uint)sp_[-1].val.intval;
      if (sp_[-1].val.intval < 1) goto LAB_002826ed;
      local_78 = (char *)0x0;
      local_80 = (CVmObjPattern *)0x0;
    }
    else {
      local_78 = vm_val_t::get_as_string(this);
      if (local_78 == (char *)0x0) {
        if ((this->typ != VM_OBJ) ||
           (iVar7 = (**(code **)(*(long *)&G_obj_table_X.pages_[pvVar6[-1].val.obj >> 0xc]
                                           [pvVar6[-1].val.obj & 0xfff].ptr_ + 8))
                              (G_obj_table_X.pages_[pvVar6[-1].val.obj >> 0xc] +
                               (pvVar6[-1].val.obj & 0xfff),CVmObjPattern::metaclass_reg_),
           iVar7 == 0)) {
          err_throw(0x900);
        }
        local_80 = (CVmObjPattern *)
                   ((long)&G_obj_table_X.pages_[pvVar6[-1].val.obj >> 0xc]->ptr_ +
                   (ulong)((pvVar6[-1].val.obj & 0xfff) * 0x18));
        local_78 = (char *)0x0;
      }
      else {
        local_80 = (CVmObjPattern *)0x0;
      }
      uVar11 = 0;
    }
    pvVar6 = sp_;
    if ((uVar2 != 1) && (sp_[-2].typ != VM_NIL)) {
      local_58 = uVar11;
      if (sp_[-2].typ == VM_INT) {
        iVar9 = sp_[-2].val.intval;
      }
      else {
        iVar9 = vm_val_t::nonint_num_to_int(sp_ + -2);
      }
      pvVar6 = sp_;
      if (iVar9 < 1) {
LAB_002826ed:
        err_throw(0x902);
      }
      uVar5 = *(undefined4 *)&local_68->field_0x4;
      aVar4 = local_68->val;
      sp_ = sp_ + 1;
      pvVar6->typ = local_68->typ;
      *(undefined4 *)&pvVar6->field_0x4 = uVar5;
      pvVar6->val = aVar4;
      iVar7 = iVar9;
      goto LAB_002824be;
    }
    uVar5 = *(undefined4 *)&local_68->field_0x4;
    aVar4 = local_68->val;
    sp_ = sp_ + 1;
    pvVar6->typ = local_68->typ;
    *(undefined4 *)&pvVar6->field_0x4 = uVar5;
    pvVar6->val = aVar4;
    if ((int)uVar11 != 0) goto LAB_00282459;
    iVar7 = 10;
    local_58 = 0;
  }
  iVar9 = -1;
LAB_002824be:
  idx = 0;
  vVar10 = CVmObjList::create(0,(long)iVar7);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar10;
  this_00 = G_obj_table_X.pages_[vVar10 >> 0xc] + (vVar10 & 0xfff);
  uVar11 = (ulong)**(ushort **)((long)&this_00->ptr_ + 8);
  if (uVar11 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this_00,0,uVar11 - 1);
  }
  pvVar6 = sp_;
  str_00 = local_60 + 1;
  uVar5 = *(undefined4 *)&retval->field_0x4;
  aVar4 = retval->val;
  sp_ = sp_ + 1;
  pvVar6->typ = retval->typ;
  *(undefined4 *)&pvVar6->field_0x4 = uVar5;
  pvVar6->val = aVar4;
  local_48 = local_58 & 0xffffffff;
  local_60 = str_00;
  do {
    if (iVar9 < 0) {
      if (len == 0) goto LAB_002826b0;
    }
    else if ((iVar9 <= (int)idx + 1) || (len == 0)) {
LAB_00282672:
      if (len != 0) {
        CVmObjList::cons_ensure_space((CVmObjList *)this_00,idx & 0xffffffff,0);
        ele.val.obj = create(0,(char *)str_00,len);
        ele.typ = VM_OBJ;
        CVmObjList::cons_set_element((CVmObjList *)this_00,idx & 0xffffffff,&ele);
        idx = (ulong)((int)idx + 1);
      }
LAB_002826b0:
      *(short *)*(char **)((long)&this_00->ptr_ + 8) = (short)idx;
      sp_ = sp_ + -(long)(int)(local_4c + 2);
      return 1;
    }
    uVar11 = local_48;
    puVar13 = str_00;
    if ((int)local_58 == 0) {
      pcVar12 = find_substr(local_68,(char *)local_60,(char *)str_00,len,local_78,local_80,
                            &match_ofs,&match_len);
      if (pcVar12 == (char *)0x0) goto LAB_00282672;
      iVar7 = (int)pcVar12 - (int)str_00;
    }
    else {
      do {
        puVar13 = (ushort *)
                  ((long)puVar13 +
                  (ulong)((((byte)*puVar13 >> 5 & 1) != 0) + 1 &
                         (uint)(byte)((byte)*puVar13 >> 7) * 3) + 1);
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      iVar7 = (int)puVar13 - (int)str_00;
      match_ofs = iVar7;
      if ((int)len <= iVar7) goto LAB_00282672;
      match_len = 0;
    }
    match_ofs = iVar7;
    CVmObjList::cons_ensure_space((CVmObjList *)this_00,idx,0);
    ele.val.obj = create(0,(char *)str_00,(long)iVar7);
    ele.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)this_00,idx,&ele);
    str_00 = (ushort *)((long)str_00 + (long)(iVar7 + match_len));
    len = len - (long)(iVar7 + match_len);
    if ((((int)local_58 == 0) && (match_len == 0)) && (len != 0)) {
      str_00 = (ushort *)
               ((long)str_00 +
               (ulong)((((byte)*str_00 >> 5 & 1) != 0) + 1 & (uint)(byte)((byte)*str_00 >> 7) * 3) +
               1);
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

int CVmObjString::getp_split(VMG_ vm_val_t *retval,
                             const vm_val_t *self_val,
                             const char *str, uint *argcp)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0, 2);
    uint argc = (argcp != 0 ? *argcp : 0);
    if (get_prop_check_argc(retval, argcp, &desc))
        return TRUE;

    /* get the string buffer and length */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the start of the base string */
    const char *basestr = str;

    /* 
     *   Get the delimiter or split size, leaving it on the stack for gc
     *   protection.  This can be a string, a RexPattern, or an integer.  
     */
    const vm_val_t *delim = G_stk->get(0);
    const char *delim_str = 0;
    CVmObjPattern *delim_pat = 0;
    int split_len = 0;
    if (argc < 1 || delim->typ == VM_NIL)
    {
        /* there's no delimiter at all, so use the default split length 1 */
        split_len = 1;
    }
    else if (delim->typ == VM_INT)
    {
        /* it's a simple split length */
        split_len = delim->val.intval;
        if (split_len <= 0)
            err_throw(VMERR_BAD_VAL_BIF);
    }
    else if ((delim_str = delim->get_as_string(vmg0_)) == 0)
    {
        /* if it's not a length or string, it has to be a RexPattern object */
        if (delim->typ != VM_OBJ
            || !CVmObjPattern::is_pattern_obj(vmg_ delim->val.obj))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the pattern object, properly cast */
        delim_pat = (CVmObjPattern *)vm_objp(vmg_ delim->val.obj);
    }

    /* get the split count limit, if there is one */
    int32_t limit = -1;
    if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* there's an explicit limit; fetch it and make sure it's at least 1 */
        if ((limit = G_stk->get(1)->num_to_int(vmg0_)) < 1)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* 
     *   Set up a return list.  If we have a limit, the list can't go over
     *   that length, so just create the list at the limit.  Otherwise, if we
     *   have a split length, we can figure the required list length by
     *   dividing the string length by the split length (rounding up).
     *   Otherwise we have no idea how many list elements we'll need, so just
     *   create the list at an arbitrary default length and expand later if
     *   needed.  
     */
    int init_list_len;
    if (limit > 0)
    {
        /* there's a limit, so we won't need more than this many elements */
        init_list_len = limit;
    }
    else if (split_len > 0)
    {
        /* split length -> divide the string length by the split length */
        init_list_len = (len + split_len - 1)/split_len;

        /* set the length to at least one, unless it's an empty string */
        if (init_list_len < 1 && len != 0)
            init_list_len = 1;
    }
    else
    {
        /* no limit or length, so start with an arbitrary guess */
        init_list_len = 10;
    }

    /* create the list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, init_list_len));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* clear the list to nils, since we're building it incrementally */
    lst->cons_clear();

    /* push it for gc protection */
    G_stk->push(retval);

    /* repeatedly search for the delimiter and split the string */
    int cnt;
    vm_val_t ele;
    for (cnt = 0 ; (limit < 0 || cnt + 1 < limit) && len != 0 ; ++cnt)
    {
        /* search for the next delimiter or next 'split_len' characters */
        int match_ofs, match_len;
        if (split_len > 0)
        {
            /* figure the number of bytes in split_len characters */
            match_ofs = utf8_ptr::s_bytelen(str, split_len);

            /* if that uses the whole rest of the string, we're done */
            if (match_ofs >= (int)len)
                break;

            /* there's no delimiter, so the delimiter match length is zero */
            match_len = 0;
        }
        else
        {
            /* search for the substring or pattern */
            const char *nxt = find_substr(
                vmg_ self_val, basestr, str, len, delim_str, delim_pat,
                &match_ofs, &match_len);

            /* if we didn't find it, we're done */
            if (nxt == 0)
                break;

            /* figure the byte offset to the match */
            match_ofs = nxt - str;
        }

        /* add the substring from 'str' to 'p' to the list */
        lst->cons_ensure_space(vmg_ cnt, 0);
        ele.set_obj(CVmObjString::create(vmg_ FALSE, str, match_ofs));
        lst->cons_set_element(cnt, &ele);

        /* skip to the position after the match */
        size_t skip = match_ofs + match_len;
        str += skip;
        len -= skip;

        /* 
         *   if we matched zero characters, skip one character to prevent an
         *   infinite loop 
         */
        if (split_len == 0 && match_len == 0 && len != 0)
            str += utf8_ptr::s_bytelen(str, 1);
    }

    /* add a final element for the remainder of the string */
    if (len != 0)
    {
        lst->cons_ensure_space(vmg_ cnt, 0);
        ele.set_obj(CVmObjString::create(vmg_ FALSE, str, len));
        lst->cons_set_element(cnt, &ele);

        /* count it */
        ++cnt;
    }

    /* set the final size of the list */
    lst->cons_set_len(cnt);

    /* discard arguments plus gc protection */
    G_stk->discard(argc + 2);

    /* handled */
    return TRUE;
}